

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmGeneratorTarget *this_00;
  cmSourceFile *source;
  bool bVar1;
  string *psVar2;
  mapped_type *this_01;
  pointer puVar3;
  pointer ppcVar4;
  pointer puVar5;
  bool hasSourceExtension;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string dir;
  string objectName;
  bool local_119;
  cmLocalUnixMakefileGenerator3 *local_118;
  pointer local_110;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_108;
  pointer local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *local_e0;
  pointer local_d8;
  cmAlphaNum local_d0;
  string local_a0;
  cmAlphaNum local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar5 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118 = this;
  local_e8 = puVar5;
  local_e0 = localObjectFiles;
  for (puVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar5; puVar3 = puVar3 + 1) {
    bVar1 = cmGeneratorTarget::CanCompileSources
                      ((puVar3->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
    if (bVar1) {
      local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00 = (puVar3->_M_t).
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
      GetConfigName_abi_cxx11_((string *)&local_80,local_118);
      cmGeneratorTarget::GetObjectSources
                (this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                         &local_108,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         (((puVar3->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->
                          LocalGenerator);
      local_80.View_._M_str = (psVar2->_M_dataplus)._M_p;
      local_80.View_._M_len = psVar2->_M_string_length;
      local_d0.View_._M_len = 1;
      local_d0.View_._M_str = local_d0.Digits_;
      local_d0.Digits_[0] = '/';
      (*(local_118->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xe]
      )(&local_50,local_118,
        (puVar3->_M_t).
        super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>._M_t.
        super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
        super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
      local_119 = true;
      local_110 = puVar3;
      cmStrCat<std::__cxx11::string,char>(&local_a0,&local_80,&local_d0,&local_50,&local_119);
      std::__cxx11::string::~string((string *)&local_50);
      local_d8 = local_108._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar4 = local_108._M_impl.super__Vector_impl_data._M_start; ppcVar4 != local_d8;
          ppcVar4 = ppcVar4 + 1) {
        source = *ppcVar4;
        local_119 = true;
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  ((string *)&local_80,(cmLocalGenerator *)local_118,source,&local_a0,&local_119,
                   (char *)0x0);
        bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&local_80);
        if (bVar1) {
          cmsys::SystemTools::GetFilenameName((string *)&local_d0,(string *)&local_80);
          std::__cxx11::string::operator=((string *)&local_80,(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                  ::operator[](local_e0,(key_type *)&local_80);
        this_01->HasSourceExtension = local_119;
        local_50._M_dataplus._M_p =
             (pointer)(local_110->_M_t).
                      super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                      .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
        cmSourceFile::GetLanguage_abi_cxx11_((string *)&local_d0,source);
        std::
        vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
        ::emplace_back<cmGeneratorTarget*,std::__cxx11::string>
                  ((vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>>
                    *)this_01,(cmGeneratorTarget **)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_80);
      }
      std::__cxx11::string::~string((string *)&local_a0);
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&local_108);
      puVar3 = local_110;
      puVar5 = local_e8;
    }
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::GetLocalObjectFiles(
  std::map<std::string, LocalObjectInfo>& localObjectFiles)
{
  for (const auto& gt : this->GetGeneratorTargets()) {
    if (!gt->CanCompileSources()) {
      continue;
    }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->GetConfigName());
    // Compute full path to object file directory for this target.
    std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                               '/', this->GetTargetDirectory(gt.get()), '/');
    // Compute the name of each object file.
    for (cmSourceFile const* sf : objectSources) {
      bool hasSourceExtension = true;
      std::string objectName =
        this->GetObjectFileNameWithoutTarget(*sf, dir, &hasSourceExtension);
      if (cmSystemTools::FileIsFullPath(objectName)) {
        objectName = cmSystemTools::GetFilenameName(objectName);
      }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.emplace_back(gt.get(), sf->GetLanguage());
    }
  }
}